

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O2

void rr::resolveMultisampleBuffer(PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  ChannelOrder CVar1;
  
  CVar1 = (src->m_access).m_format.order;
  if (CVar1 == DS) {
    resolveMultisampleDepthBuffer(dst,src);
  }
  else if (CVar1 != S) {
    if (CVar1 == D) {
      resolveMultisampleDepthBuffer(dst,src);
      return;
    }
    resolveMultisampleColorBuffer(dst,src);
    return;
  }
  resolveMultisampleStencilBuffer(dst,src);
  return;
}

Assistant:

void resolveMultisampleBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	switch (src.raw().getFormat().order)
	{
		case tcu::TextureFormat::D:
			resolveMultisampleDepthBuffer(dst, src);
			return;

		case tcu::TextureFormat::S:
			resolveMultisampleStencilBuffer(dst, src);
			return;

		case tcu::TextureFormat::DS:
			resolveMultisampleDepthBuffer(dst, src);
			resolveMultisampleStencilBuffer(dst, src);
			return;

		default:
			resolveMultisampleColorBuffer(dst, src);
			return;
	}
}